

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O0

void Acec_ManDerive_rec(Gia_Man_t *pNew,Gia_Man_t *p,int Node,Vec_Int_t *vMirrors)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  int local_34;
  int Obj;
  Gia_Obj_t *pObj;
  Vec_Int_t *vMirrors_local;
  int Node_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Vec_IntEntry(vMirrors,Node);
  local_34 = Node;
  if (-1 < iVar1) {
    iVar1 = Vec_IntEntry(vMirrors,Node);
    local_34 = Abc_Lit2Var(iVar1);
  }
  pGVar4 = Gia_ManObj(p,local_34);
  if (pGVar4->Value == 0xffffffff) {
    iVar1 = Gia_ObjIsAnd(pGVar4);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                    ,0x39,"void Acec_ManDerive_rec(Gia_Man_t *, Gia_Man_t *, int, Vec_Int_t *)");
    }
    iVar1 = Gia_ObjFaninId0(pGVar4,local_34);
    Acec_ManDerive_rec(pNew,p,iVar1,vMirrors);
    iVar1 = Gia_ObjFaninId1(pGVar4,local_34);
    Acec_ManDerive_rec(pNew,p,iVar1,vMirrors);
    iVar1 = Gia_ObjIsXor(pGVar4);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjFanin0Copy(pGVar4);
      iVar2 = Gia_ObjFanin1Copy(pGVar4);
      uVar3 = Gia_ManAppendAnd(pNew,iVar1,iVar2);
      pGVar4->Value = uVar3;
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pGVar4);
      iVar2 = Gia_ObjFanin1Copy(pGVar4);
      uVar3 = Gia_ManAppendXorReal(pNew,iVar1,iVar2);
      pGVar4->Value = uVar3;
    }
  }
  if (local_34 != Node) {
    uVar3 = pGVar4->Value;
    iVar1 = Vec_IntEntry(vMirrors,Node);
    iVar1 = Abc_LitIsCompl(iVar1);
    uVar3 = Abc_LitNotCond(uVar3,iVar1);
    pGVar4 = Gia_ManObj(p,Node);
    pGVar4->Value = uVar3;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////



////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Acec_ManDerive_rec( Gia_Man_t * pNew, Gia_Man_t * p, int Node, Vec_Int_t * vMirrors )
{
    Gia_Obj_t * pObj;
    int Obj = Node;
    if ( Vec_IntEntry(vMirrors, Node) >= 0 )
        Obj = Abc_Lit2Var( Vec_IntEntry(vMirrors, Node) );
    pObj = Gia_ManObj( p, Obj );
    if ( !~pObj->Value )
    {
        assert( Gia_ObjIsAnd(pObj) );
        Acec_ManDerive_rec( pNew, p, Gia_ObjFaninId0(pObj, Obj), vMirrors );
        Acec_ManDerive_rec( pNew, p, Gia_ObjFaninId1(pObj, Obj), vMirrors );
        if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManAppendXorReal( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    // set the original node as well
    if ( Obj != Node )
        Gia_ManObj(p, Node)->Value = Abc_LitNotCond( pObj->Value, Abc_LitIsCompl(Vec_IntEntry(vMirrors, Node)) );
}